

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ootake_PSG.c
# Opt level: O2

void OPSG_Write(void *chip,UINT8 regNum,UINT8 data)

{
  int iVar1;
  uint *puVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  undefined1 uVar6;
  byte bVar7;
  uint uVar8;
  Sint32 SVar9;
  huc6280_state *info;
  Sint32 SVar10;
  double dVar11;
  
  *(UINT8 *)((long)chip + (ulong)(regNum & 0xf) + 0x660) = data;
  switch((ulong)(regNum & 0xf)) {
  case 0:
    *(uint *)((long)chip + 0x620) = (uint)(data & 7);
    return;
  case 1:
    *(uint *)((long)chip + 0x624) = (uint)(data >> 4);
    *(uint *)((long)chip + 0x628) = data & 0xf;
    for (lVar5 = 0; lVar5 != 0x450; lVar5 = lVar5 + 0xb8) {
      iVar1 = *(int *)((long)chip + lVar5 + 0x2c);
      SVar10 = 0;
      SVar9 = 0;
      if (iVar1 != 0) {
        SVar9 = _VolumeTable[(iVar1 + (uint)(data >> 4)) * 2 + *(int *)((long)chip + lVar5 + 0x28)];
      }
      *(Sint32 *)((long)chip + lVar5 + 0x34) = SVar9;
      iVar1 = *(int *)((long)chip + lVar5 + 0x30);
      if (iVar1 != 0) {
        SVar10 = _VolumeTable[(iVar1 + (data & 0xf)) * 2 + *(int *)((long)chip + lVar5 + 0x28)];
      }
      *(Sint32 *)((long)chip + lVar5 + 0x38) = SVar10;
    }
    break;
  case 2:
    puVar2 = (uint *)((long)chip + (ulong)*(uint *)((long)chip + 0x620) * 0xb8 + 0x20);
    uVar4 = *puVar2 & 0xffffff00;
    uVar8 = (uint)data;
    goto LAB_0015b161;
  case 3:
    puVar2 = (uint *)((long)chip + (ulong)*(uint *)((long)chip + 0x620) * 0xb8 + 0x20);
    uVar4 = *puVar2 & 0xfffff0ff;
    uVar8 = (uint)(data & 0xf) << 8;
LAB_0015b161:
    *puVar2 = uVar4 + uVar8;
    uVar4 = (uVar4 + uVar8) - 1 & 0xfff;
    if (uVar4 == 0) {
      puVar2[0x2a] = 0;
      return;
    }
    puVar2[0x2a] = (uint)(long)((*(double *)((long)chip + 0x18) * 134217728.0) / (double)uVar4 + 0.5
                               );
    return;
  case 4:
    uVar3 = (ulong)*(uint *)((long)chip + 0x620);
    lVar5 = (long)chip + uVar3 * 0xb8 + 0x20;
    if (((*(char *)((long)chip + 0x670) != '\0') && (data == '\0')) &&
       (*(char *)((long)chip + uVar3 * 0xb8 + 0x24) != '\0')) {
      if ((*(byte *)((long)chip + 0x624) & 1) == 0) {
        *(undefined4 *)((long)chip + uVar3 * 0xb8 + 0x2c) = 0;
      }
      if ((*(byte *)((long)chip + 0x628) & 1) == 0) {
        *(undefined4 *)((long)chip + uVar3 * 0xb8 + 0x30) = 0;
      }
    }
    *(UINT8 *)((long)chip + uVar3 * 0xb8 + 0x24) = data >> 7;
    if (((data & 0x40) == 0) && (*(char *)((long)chip + uVar3 * 0xb8 + 0x25) != '\0')) {
      *(int *)((long)chip + uVar3 * 4 + 0x5e0) =
           (int)((double)(*(int *)((long)chip + uVar3 * 0xb8 + 0x34) *
                         *(int *)((long)chip + uVar3 * 0xb8 + 0xc0)) * 0.305998999951);
      *(int *)((long)chip + (ulong)*(uint *)((long)chip + 0x620) * 4 + 0x600) =
           (int)((double)(*(int *)((long)chip + uVar3 * 0xb8 + 0x38) *
                         *(int *)((long)chip + uVar3 * 0xb8 + 0xc0)) * 0.305998999951);
    }
    bVar7 = data >> 6 & 1;
    *(byte *)((long)chip + uVar3 * 0xb8 + 0x25) = bVar7;
    if ((data & 0xffffffc0) == 0x40) {
      if (((bVar7 == 0) || (*(int *)((long)chip + uVar3 * 0xb8 + 0xbc) != 0)) ||
         ((uVar6 = 1, *(int *)((long)chip + uVar3 * 0xb8 + 0x2c) == 0 &&
          (*(int *)((long)chip + uVar3 * 0xb8 + 0x30) == 0)))) {
        uVar6 = 0;
      }
      *(undefined1 *)((long)chip + (ulong)*(uint *)((long)chip + 0x620) + 0x658) = uVar6;
      *(undefined4 *)((long)chip + uVar3 * 0xb8 + 0xbc) = 0;
    }
    uVar4 = data & 0x1f;
    *(uint *)((long)chip + uVar3 * 0xb8 + 0x28) = uVar4;
    if ((data & 0x1f) != 0) {
      iVar1 = *(int *)((long)chip + uVar3 * 0xb8 + 0x2c);
      if (iVar1 == 0) {
        SVar9 = 0;
      }
      else {
        SVar9 = _VolumeTable[uVar4 + (iVar1 + *(int *)((long)chip + 0x624)) * 2];
      }
      *(Sint32 *)((long)chip + uVar3 * 0xb8 + 0x34) = SVar9;
      iVar1 = *(int *)((long)chip + uVar3 * 0xb8 + 0x30);
      if (iVar1 != 0) {
        uVar4 = uVar4 + (iVar1 + *(int *)((long)chip + 0x628)) * 2;
LAB_0015b3a0:
        *(Sint32 *)(lVar5 + 0x18) = _VolumeTable[uVar4];
        return;
      }
      goto LAB_0015b3ae;
    }
    goto LAB_0015b385;
  case 5:
    uVar4 = *(uint *)((long)chip + 0x620);
    lVar5 = (long)chip + (ulong)uVar4 * 0xb8 + 0x20;
    *(uint *)((long)chip + (ulong)uVar4 * 0xb8 + 0x2c) = (uint)(data >> 4);
    *(uint *)((long)chip + (ulong)uVar4 * 0xb8 + 0x30) = data & 0xf;
    iVar1 = *(int *)((long)chip + (ulong)uVar4 * 0xb8 + 0x28);
    if (iVar1 != 0) {
      SVar9 = 0;
      if (0xf < data) {
        SVar9 = _VolumeTable[iVar1 + ((uint)(data >> 4) + *(int *)((long)chip + 0x624)) * 2];
      }
      *(Sint32 *)((long)chip + (ulong)uVar4 * 0xb8 + 0x34) = SVar9;
      if ((data & 0xf) != 0) {
        uVar4 = iVar1 + ((data & 0xf) + *(int *)((long)chip + 0x628)) * 2;
        goto LAB_0015b3a0;
      }
      goto LAB_0015b3ae;
    }
LAB_0015b385:
    *(undefined4 *)(lVar5 + 0x14) = 0;
LAB_0015b3ae:
    *(undefined4 *)(lVar5 + 0x18) = 0;
    return;
  case 6:
    uVar3 = (ulong)*(uint *)((long)chip + 0x620);
    bVar7 = data & 0x1f;
    if ((((*(char *)((long)chip + uVar3 + 0x658) == '\0') ||
         (*(char *)((long)chip + uVar3 * 0xb8 + 0x25) == '\0')) ||
        (*(int *)((long)chip + uVar3 * 0xb8 + 0xbc) != 0)) ||
       ((*(int *)((long)chip + uVar3 * 0xb8 + 0x2c) == 0 &&
        (*(int *)((long)chip + uVar3 * 0xb8 + 0x30) == 0)))) {
      *(undefined1 *)((long)chip + uVar3 + 0x658) = 0;
    }
    else {
      for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 1) {
        *(undefined4 *)((long)chip + lVar5 * 4 + uVar3 * 0xb8 + 0x3c) = 0xfffffff2;
      }
    }
    if (*(char *)((long)chip + uVar3 * 0xb8 + 0x24) == '\0') {
      uVar4 = *(uint *)((long)chip + uVar3 * 0xb8 + 0xbc);
      *(uint *)((long)chip + uVar3 * 0xb8 + 0xbc) = uVar4 + 1;
      *(uint *)((long)chip + (ulong)uVar4 * 4 + uVar3 * 0xb8 + 0x3c) = 0x11 - (uint)bVar7;
      puVar2 = (uint *)((long)chip + uVar3 * 0xb8 + 0xbc);
      *puVar2 = *puVar2 & 0x1f;
    }
    if (*(char *)((long)chip + uVar3 * 0xb8 + 0x25) != '\0') {
      uVar4 = 6;
      if (6 < bVar7) {
        uVar4 = (uint)bVar7;
      }
      *(uint *)((long)chip + uVar3 * 0xb8 + 0xc0) = 0xb - uVar4;
      return;
    }
    break;
  case 7:
    uVar3 = (ulong)*(uint *)((long)chip + 0x620);
    if (3 < uVar3) {
      *(UINT8 *)((long)chip + uVar3 * 0xb8 + 0xcc) = data >> 7;
      uVar4 = (uint)(data & 0x1f ^ 0x1f);
      *(uint *)((long)chip + uVar3 * 0xb8 + 0xd0) = uVar4;
      dVar11 = *(double *)((long)chip + 0x18) * 2048.0;
      if ((data & 0x1f) != 0x1f) {
        dVar11 = dVar11 / (double)uVar4;
      }
      *(int *)((long)chip + uVar3 * 0xb8 + 0xd4) = (int)(long)(dVar11 + 0.5);
      return;
    }
    break;
  case 8:
    *(uint *)((long)chip + 0x62c) = (uint)data;
    return;
  case 9:
    if ((char)data < '\0') {
      *(undefined4 *)((long)chip + 0x17c) = 0;
    }
    uVar4 = (uint)(data & 7);
    if (3 < (data & 7)) {
      uVar4 = 0;
    }
    *(uint *)((long)chip + 0x634) = uVar4;
  }
  return;
}

Assistant:

INLINE void
write_reg(
	huc6280_state* info,
	Uint8		reg,
	Uint8		data)
{
	Uint32	i;
	Uint32	frq;//Kitao追加
	PSG*	PSGChn;

	info->Port[reg & 15] = data;

	switch (reg & 15)
	{
		case 0:	// register select
			info->Channel = data & 7;
			break;

		case 1:	// main volume
			info->MainVolumeL = (data >> 4) & 0x0F;
			info->MainVolumeR = data & 0x0F;

			/* LMAL, RMAL は全チャネルの音量に影響する */
			for (i = 0; i < N_CHANNEL; i++)
			{
				PSGChn = &info->Psg[i];
				if (PSGChn->volumeL == 0) //volumeLが0の場合、volumeの値があってもL音量は0とする。スーパーバレーボールの笛後やイメージファイトのやられた後等で必要。※volumeだけが0のときにL音量を0にしてしまうとグラディウスのコナミ起動音で不具合。v2.81追加
					PSGChn->outVolumeL = 0;
				else
					PSGChn->outVolumeL = _VolumeTable[PSGChn->volume + (info->MainVolumeL + PSGChn->volumeL) * 2];
				if (PSGChn->volumeR == 0) //volumeRが0の場合、volumeの値があってもR音量は0とする。スーパーバレーボールの笛後やイメージファイトのやられた後等で必要。v2.81追加
					PSGChn->outVolumeR = 0;
				else
					PSGChn->outVolumeR = _VolumeTable[PSGChn->volume + (info->MainVolumeR + PSGChn->volumeR) * 2];
			}
			break;

		case 2:	// frequency low
			PSGChn = &info->Psg[info->Channel];
			PSGChn->frq &= ~0xFF;
			PSGChn->frq |= data;
			//Kitao更新。update_frequencyは、速度アップのためサブルーチンにせず直接実行するようにした。
			frq = (PSGChn->frq - 1) & 0xFFF;
			if (frq)
				PSGChn->deltaPhase = (Uint32)((double)(65536.0 * 256.0 * 8.0 * info->RESMPL_RATE) / (double)frq +0.5); //Kitao更新。速度アップのためfrq以外は定数計算にした。精度向上のため、先に値の小さいOVERSAMPLE_RATEのほうで割るようにした。+0.5は四捨五入で精度アップ。プチノイズ軽減のため。
			else
				PSGChn->deltaPhase = 0;
			break;

		case 3:	// frequency high
			PSGChn = &info->Psg[info->Channel];
			PSGChn->frq &= ~0xF00;
			PSGChn->frq |= (data & 0x0F) << 8;
			//Kitao更新。update_frequencyは、速度アップのためサブルーチンにせず直接実行するようにした。
			frq = (PSGChn->frq - 1) & 0xFFF;
			if (frq)
				PSGChn->deltaPhase = (Uint32)((double)(65536.0 * 256.0 * 8.0 * info->RESMPL_RATE) / (double)frq +0.5); //Kitao更新。速度アップのためfrq以外は定数計算にした。精度向上のため、先に値の小さいOVERSAMPLE_RATEのほうで割るようにした。+0.5は四捨五入で精度アップ。プチノイズ軽減のため。
			else
				PSGChn->deltaPhase = 0;
			break;

		case 4:	// ON, DDA, AL
			PSGChn = &info->Psg[info->Channel];
			if (info->bHoneyInTheSky) //はにいいんざすかいのポーズ時に、微妙なボリューム調整タイミングの問題でプチノイズが載ってしまうので、現状はパッチ処理で対応。v2.60更新
			{
				if ((PSGChn->bOn)&&(data == 0)) //発声中にdataが0の場合、LRボリュームも0にリセット。はにいいんざすかいのポーズ時のノイズが解消。(data & 0x1F)だけが0のときにリセットすると、サイレントデバッガーズ等でNG。発声してない時にリセットするとアトミックロボでNG。ｖ2.55
				{
					//PRINTF("test %X %X %X %X",info->Channel,PSGChn->bOn,info->MainVolumeL,info->MainVolumeR);
					if ((info->MainVolumeL & 1) == 0) //メインボリュームのbit0が0のときだけ処理(はにいいんざすかいでイレギュラーな0xE。他のゲームは0xF。※ヘビーユニットも0xEだった)。これがないとミズバク大冒険で音が出ない。実機の仕組みと同じかどうかは未確認。v2.53追加
						PSGChn->volumeL = 0;
					if ((info->MainVolumeR & 1) == 0) //右チャンネルも同様とする
						PSGChn->volumeR = 0;
				}
			}

			PSGChn->bOn = ((data & 0x80) != 0);

			if ((PSGChn->bDDA)&&((data & 0x40)==0)) //DDAからWAVEへ切り替わるとき or DDAから消音するとき
			{
				//Kitao追加。DDAはいきなり消音すると目立つノイズが載るのでフェードアウトする。
				info->DdaFadeOutL[info->Channel] = (Sint32)((double)(PSGChn->ddaSample * PSGChn->outVolumeL) *
															((1 + (1 >> 3) + (1 >> 4) + (1 >> 5) + (1 >> 7) + (1 >> 12) + (1 >> 14) + (1 >> 15)) * SAMPLE_FADE_DECLINE)); //元の音量。v2.65更新
				info->DdaFadeOutR[info->Channel] = (Sint32)((double)(PSGChn->ddaSample * PSGChn->outVolumeR) *
															((1 + (1 >> 3) + (1 >> 4) + (1 >> 5) + (1 >> 7) + (1 >> 12) + (1 >> 14) + (1 >> 15)) * SAMPLE_FADE_DECLINE));
			}
			PSGChn->bDDA = ((data & 0x40) != 0);

			//Kitao追加。dataのbit7,6が01のときにWaveインデックスをリセットする。
			if ((data & 0xC0) == 0x40)
			{
				if ((PSGChn->bDDA)&&(PSGChn->waveIndex == 0)&& //DDAモードでwaveIndexが0のとき、Waveデータをリセットする。実機で同様の動きかは未確認。F1トリプルバトル。フォーメーションサッカー'90試合中BGM。v2.79
					((PSGChn->volumeL > 0)||(PSGChn->volumeR > 0))) //Volumeが0のときに行うとゼビウスでPAUSE後音が薄くなる。v2.82追加
				{
					//PRINTF("test4 %X %X %X %X %X",info->Channel,data,PSGChn->waveIndex,PSGChn->volumeL,PSGChn->volumeR); //Kitaoテスト用
					info->bWaveReset[info->Channel] = TRUE; //v2.81追加。フォーメーションサッカー'90，F1トリプルバトル，ファイプロシリーズで必要。
				}
				else
					info->bWaveReset[info->Channel] = FALSE; //v2.81追加
				PSGChn->waveIndex = 0;
			}

			PSGChn->volume = data & 0x1F;
			if ((PSGChn->volume == 0)||(PSGChn->volumeL == 0)) //スーパーバレーボールの笛後等に必要。v2.81追加
				PSGChn->outVolumeL = 0;
			else
				PSGChn->outVolumeL = _VolumeTable[PSGChn->volume + (info->MainVolumeL + PSGChn->volumeL) * 2];
			if ((PSGChn->volume == 0)||(PSGChn->volumeR == 0)) //スーパーバレーボールの笛後等に必要。v2.81追加
				PSGChn->outVolumeR = 0;
			else
				PSGChn->outVolumeR = _VolumeTable[PSGChn->volume + (info->MainVolumeR + PSGChn->volumeR) * 2];
			break;

		case 5:	// LAL, RAL
			PSGChn = &info->Psg[info->Channel];
			//PRINTF("test5 %X %X %X %X %X",info->Channel,data,PSGChn->waveIndex,PSGChn->volumeL,PSGChn->volumeR); //Kitaoテスト用
			PSGChn->volumeL = (data >> 4) & 0xF;
			PSGChn->volumeR = data & 0xF;
			if ((PSGChn->volume == 0)||(PSGChn->volumeL == 0)) //グラディウスでポーズ時に必要。v2.81追加
				PSGChn->outVolumeL = 0;
			else
				PSGChn->outVolumeL = _VolumeTable[PSGChn->volume + (info->MainVolumeL + PSGChn->volumeL) * 2];
			if ((PSGChn->volume == 0)||(PSGChn->volumeR == 0)) //グラディウスでポーズ時に必要。v2.81追加
				PSGChn->outVolumeR = 0;
			else
				PSGChn->outVolumeR = _VolumeTable[PSGChn->volume + (info->MainVolumeR + PSGChn->volumeR) * 2];
			break;

		case 6:	// wave data  //Kitao更新。DDAモードのときもWaveデータを更新するようにした。v0.63。ファイヤープロレスリング
			PSGChn = &info->Psg[info->Channel];
			data &= 0x1F;

			if ((info->bWaveReset[info->Channel])&&(PSGChn->bDDA)&&(PSGChn->waveIndex == 0)&& //DDAモードでwaveIndexが0のとき、Waveデータをリセットする。実機で同様の動きかは未確認。F1トリプルバトル。フォーメーションサッカー'90試合中BGM。v2.79
				((PSGChn->volumeL > 0)||(PSGChn->volumeR > 0))) //Volumeが0のときに行うとゼビウスでPAUSE後音が薄くなる。v2.82追加
			{
				//PRINTF("test6 %X %X %X %X %X",info->Channel,data,PSGChn->waveIndex,PSGChn->volumeL,PSGChn->volumeR); //Kitaoテスト用
				for (i=0; i<32; i++)
					PSGChn->wave[i] = -14; //最小値で初期化。フォーメーションサッカー'90，F1トリプルバトル，ファイプロシリーズで必要。
			}
			else
				info->bWaveReset[info->Channel] = FALSE; //v2.82追加

			if (!PSGChn->bOn) //Kitao追加。音を鳴らしていないときだけWaveデータを更新する。v0.65。F1トリプルバトルのエンジン音。
			{
				PSGChn->wave[PSGChn->waveIndex++] = 17 - data; //17。Kitao更新。一番心地よく響く値に。ミズバク大冒険，モトローダー，ドラゴンスピリット等で調整。
				PSGChn->waveIndex &= 0x1F;
			}

			if (PSGChn->bDDA)
			{
				//Kitao更新。ノイズ軽減のため6より下側の値はカットするようにした。v0.59
				if (data < 6) //サイバーナイトで6に決定
					data = 6; //ノイズが多いので小さな値はカット
				PSGChn->ddaSample = 11 - data; //サイバーナイトで11に決定。ドラムの音色が最適。v0.74
			}
			break;

		case 7:	// noise on, noise frq
			if (info->Channel >= 4)
			{
				PSGChn = &info->Psg[info->Channel];
				PSGChn->bNoiseOn = ((data & 0x80) != 0);
				PSGChn->noiseFrq = 0x1F - (data & 0x1F);
				if (PSGChn->noiseFrq == 0)
					PSGChn->deltaNoisePhase = (Uint32)((double)(2048.0 * info->RESMPL_RATE) +0.5); //Kitao更新
				else
					PSGChn->deltaNoisePhase = (Uint32)((double)(2048.0 * info->RESMPL_RATE) / (double)PSGChn->noiseFrq +0.5); //Kitao更新
			}
			break;

		case 8:	// LFO frequency
			info->LfoFrq = data;
			//Kitaoテスト用
			//PRINTF("LFO Frq = %X",info->LfoFrq);
			break;

		case 9:	// LFO control  Kitao更新。シンプルに実装してみた。実機で同じ動作かは未確認。はにいいんざすかいの音が似るように実装。v1.59
			if (data & 0x80) //bit7を立てて呼ぶと恐らくリセット
			{
				info->Psg[1].phase = 0; //LfoFrqは初期化しない。はにいいんざすかい。
				//Kitaoテスト用
				//PRINTF("LFO control = %X",data);
			}
			info->LfoCtrl = data & 7; //ドロップロックほらホラで5が使われる。v1.61更新
			if (info->LfoCtrl & 4)
				info->LfoCtrl = 0; //ドロップロックほらホラ。実機で聴いた感じはLFOオフと同じ音のようなのでbit2が立っていた(負の数扱い？)ら0と同じこととする。
			//Kitaoテスト用
			//PRINTF("LFO control = %X,  Frq =%X",data,info->LfoFrq);
			break;

		default:	// invalid write
			break;
	}

	return;
}